

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O3

bool __thiscall
HighsHashTable<int,std::pair<double,int>>::insert<HighsHashTableEntry<int,std::pair<double,int>>>
          (HighsHashTable<int,std::pair<double,int>> *this,
          HighsHashTableEntry<int,_std::pair<double,_int>_> *args)

{
  undefined8 *puVar1;
  double dVar2;
  u8 uVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  u8 meta;
  u64 pos;
  Entry entry;
  u64 maxPos;
  u64 startPos;
  u8 local_41;
  ulong local_40;
  HighsHashTableEntry<int,_std::pair<double,_int>_> local_38;
  ulong local_18;
  ulong local_10;
  
  local_38.value_.second = (args->value_).second;
  local_38.value_._12_4_ = *(undefined4 *)&(args->value_).field_0xc;
  local_38.key_ = args->key_;
  local_38._4_4_ = *(undefined4 *)&args->field_0x4;
  local_38.value_.first = (args->value_).first;
  bVar8 = HighsHashTable<int,_std::pair<double,_int>_>::findPosition
                    ((HighsHashTable<int,_std::pair<double,_int>_> *)this,&local_38.key_,&local_41,
                     &local_10,&local_18,&local_40);
  if (bVar8) {
    bVar8 = false;
  }
  else {
    uVar9 = *(ulong *)(this + 0x10);
    if ((*(ulong *)(this + 0x20) != uVar9 * 7 + 7 >> 3) && (local_40 != local_18)) {
      lVar4 = *(long *)this;
      *(ulong *)(this + 0x20) = *(ulong *)(this + 0x20) + 1;
      uVar10 = local_18;
      do {
        lVar5 = *(long *)(this + 8);
        if (-1 < (char)*(byte *)(lVar5 + local_40)) {
          *(u8 *)(lVar5 + local_40) = local_41;
          *(undefined8 *)(lVar4 + 0x10 + local_40 * 0x18) = local_38.value_._8_8_;
          puVar1 = (undefined8 *)(lVar4 + local_40 * 0x18);
          *puVar1 = local_38._0_8_;
          puVar1[1] = local_38.value_.first;
          return true;
        }
        uVar11 = (ulong)((int)local_40 - (uint)*(byte *)(lVar5 + local_40) & 0x7f);
        if (uVar11 < (local_40 - local_10 & uVar9)) {
          iVar6 = local_38.key_;
          iVar7 = local_38.value_.second;
          local_38.key_ = *(int *)(lVar4 + local_40 * 0x18);
          dVar2 = *(double *)(lVar4 + 8 + local_40 * 0x18);
          local_38.value_.second = *(int *)(lVar4 + 0x10 + local_40 * 0x18);
          *(int *)(lVar4 + local_40 * 0x18) = iVar6;
          *(double *)(lVar4 + 8 + local_40 * 0x18) = local_38.value_.first;
          *(int *)(lVar4 + 0x10 + local_40 * 0x18) = iVar7;
          uVar3 = *(u8 *)(lVar5 + local_40);
          *(u8 *)(lVar5 + local_40) = local_41;
          uVar9 = *(ulong *)(this + 0x10);
          local_10 = local_40 - uVar11 & uVar9;
          uVar10 = local_10 + 0x7f & uVar9;
          local_41 = uVar3;
          local_38.value_.first = dVar2;
          local_18 = uVar10;
        }
        local_40 = local_40 + 1 & uVar9;
      } while (local_40 != uVar10);
      HighsHashTable<int,_std::pair<double,_int>_>::growTable
                ((HighsHashTable<int,_std::pair<double,_int>_> *)this);
      insert<HighsHashTableEntry<int,std::pair<double,int>>>(this,&local_38);
      return true;
    }
    HighsHashTable<int,_std::pair<double,_int>_>::growTable
              ((HighsHashTable<int,_std::pair<double,_int>_> *)this);
    bVar8 = insert<HighsHashTableEntry<int,std::pair<double,int>>>(this,&local_38);
  }
  return bVar8;
}

Assistant:

bool insert(Args&&... args) {
    Entry entry(std::forward<Args>(args)...);

    u64 pos, startPos, maxPos;
    u8 meta;
    if (findPosition(entry.key(), meta, startPos, maxPos, pos)) return false;

    if (numElements == ((tableSizeMask + 1) * 7) / 8 || pos == maxPos) {
      growTable();
      return insert(std::move(entry));
    }

    using std::swap;
    Entry* entryArray = entries.get();
    ++numElements;

    do {
      if (!occupied(metadata[pos])) {
        metadata[pos] = meta;
        new (&entryArray[pos]) Entry{std::move(entry)};
        return true;
      }

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      u64 distanceOfCurrentOccupant = distanceFromIdealSlot(pos);
      if (currentDistance > distanceOfCurrentOccupant) {
        // steal the position
        swap(entry, entryArray[pos]);
        swap(meta, metadata[pos]);

        startPos = (pos - distanceOfCurrentOccupant) & tableSizeMask;
        maxPos = (startPos + maxDistance()) & tableSizeMask;
      }
      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    growTable();
    insert(std::move(entry));
    return true;
  }